

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,BrInstr *brInstr)

{
  bool bVar1;
  
  bVar1 = BasicBlock::isAfter((brInstr->super_TerminateInstr).super_Instr.basicBlock_,
                              (BasicBlock *)
                              *(brInstr->super_TerminateInstr).super_Instr.operands_.
                               super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    return;
  }
  emitJump(this,(BasicBlock *)
                *(brInstr->super_TerminateInstr).super_Instr.operands_.
                 super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
  return;
}

Assistant:

void TargetCodeGenerator::visit(BrInstr& brInstr) {
  // Do not emit the JMP if the target block is emitted right after this block
  // (and thus, right after this instruction).
  if (brInstr.getBasicBlock()->isAfter(brInstr.targetBlock()))
    return;

  emitJump(brInstr.targetBlock());
}